

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O2

void __thiscall
Assimp::ValidateDSProcess::DoValidationWithNameCheck<aiLight>
          (ValidateDSProcess *this,aiLight **array,uint size,char *firstName,char *secondName)

{
  int iVar1;
  ValidateDSProcess *pVVar2;
  ulong uVar3;
  string name;
  allocator local_51;
  ValidateDSProcess local_50;
  
  DoValidationEx<aiLight>(this,array,size,firstName,secondName);
  uVar3 = 0;
  while( true ) {
    if (size == uVar3) {
      return;
    }
    iVar1 = HasNameMatch(&array[uVar3]->mName,this->mScene->mRootNode);
    if (iVar1 != 1) break;
    uVar3 = uVar3 + 1;
  }
  if (iVar1 == 0) {
    pVVar2 = &local_50;
    std::__cxx11::string::string((string *)pVVar2,(array[uVar3]->mName).data,&local_51);
    ReportError(pVVar2,"aiScene::%s[%i] has no corresponding node in the scene graph (%s)",firstName
                ,uVar3 & 0xffffffff,local_50.super_BaseProcess._vptr_BaseProcess);
  }
  pVVar2 = &local_50;
  std::__cxx11::string::string((string *)pVVar2,(array[uVar3]->mName).data,&local_51);
  ReportError(pVVar2,"aiScene::%s[%i]: there are more than one nodes with %s as name",firstName,
              uVar3 & 0xffffffff,local_50.super_BaseProcess._vptr_BaseProcess);
}

Assistant:

inline
void ValidateDSProcess::DoValidationWithNameCheck(T** array, unsigned int size, const char* firstName,
        const char* secondName) {
    // validate all entries
    DoValidationEx(array,size,firstName,secondName);

    for (unsigned int i = 0; i < size;++i) {
        int res = HasNameMatch(array[i]->mName,mScene->mRootNode);
        if (0 == res)   {
            const std::string name = static_cast<char*>(array[i]->mName.data);
            ReportError("aiScene::%s[%i] has no corresponding node in the scene graph (%s)",
                firstName,i, name.c_str());
        } else if (1 != res)  {
            const std::string name = static_cast<char*>(array[i]->mName.data);
            ReportError("aiScene::%s[%i]: there are more than one nodes with %s as name",
                firstName,i, name.c_str());
        }
    }
}